

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

int sylvan_sat_one(BDD bdd,BDDSET vars,uint8_t *str)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = 0;
  if (str != (uint8_t *)0x0 && bdd != 0) {
    iVar2 = 1;
    do {
      lVar4 = (vars & 0xffffffffff) * 0x10;
      puVar1 = nodes->data;
      if (bdd == 0x8000000000000000) {
        *str = '\0';
        bdd = 0x8000000000000000;
      }
      else {
        lVar3 = (bdd & 0xffffffffff) * 0x10;
        if ((*(ulong *)(puVar1 + lVar4 + 8) ^ *(ulong *)(puVar1 + lVar3 + 8)) < 0x10000000000) {
          if ((*(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff) == 0 &&
              (bdd & 0x8000000000000000) == 0) {
            *str = '\x01';
            bdd = *(ulong *)(puVar1 + lVar3) & 0x800000ffffffffff;
          }
          else {
            *str = '\0';
            bdd = bdd & 0x8000000000000000 | *(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff;
          }
        }
        else {
          *str = '\0';
        }
      }
      str = str + 1;
      vars = vars & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff;
    } while (vars != 0x8000000000000000);
  }
  return iVar2;
}

Assistant:

int
sylvan_sat_one(BDD bdd, BDDSET vars, uint8_t *str)
{
    if (bdd == sylvan_false) return 0;
    if (str == NULL) return 0;
    if (sylvan_set_isempty(vars)) return 1;

    for (;;) {
        bddnode_t n_vars = MTBDD_GETNODE(vars);
        if (bdd == sylvan_true) {
            *str = 0;
        } else {
            bddnode_t n_bdd = MTBDD_GETNODE(bdd);
            if (bddnode_getvariable(n_bdd) != bddnode_getvariable(n_vars)) {
                *str = 0;
            } else {
                if (node_low(bdd, n_bdd) == sylvan_false) {
                    // take high edge
                    *str = 1;
                    bdd = node_high(bdd, n_bdd);
                } else {
                    // take low edge
                    *str = 0;
                    bdd = node_low(bdd, n_bdd);
                }
            }
        }
        vars = node_high(vars, n_vars);
        if (sylvan_set_isempty(vars)) break;
        str++;
    }

    return 1;
}